

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScenePrivate::setFocusItemHelper
          (QGraphicsScenePrivate *this,QGraphicsItem *item,FocusReason focusReason,
          bool emitFocusChanged)

{
  QGraphicsScene *this_00;
  long lVar1;
  QGraphicsView **ppQVar2;
  bool bVar3;
  GraphicsItemFlags GVar4;
  QGraphicsScene *pQVar5;
  QGraphicsItem *this_01;
  long lVar6;
  long in_FS_OFFSET;
  FocusReason local_6c;
  QGraphicsItem *local_68;
  QGraphicsItem *local_60;
  undefined1 *local_58;
  QGraphicsItem **ppQStack_50;
  QGraphicsItem **local_48;
  FocusReason *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->focusItem == item) goto LAB_00600fe9;
  this_00 = *(QGraphicsScene **)&this->field_0x8;
  if ((((item == (QGraphicsItem *)0x0) ||
       (GVar4 = QGraphicsItem::flags(item),
       ((uint)GVar4.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
              super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 4) == 0)) ||
      (bVar3 = QGraphicsItem::isVisible(item), !bVar3)) ||
     (bVar3 = QGraphicsItem::isEnabled(item), !bVar3)) {
    this_01 = this->focusItem;
    bVar3 = true;
    item = (QGraphicsItem *)0x0;
LAB_00600e3a:
    if (this_01 != (QGraphicsItem *)0x0) {
      this->lastFocusItem = this_01;
      GVar4 = QGraphicsItem::flags(this_01);
      if ((((uint)GVar4.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                  super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i >> 0xc & 1) != 0) &&
         (QCoreApplication::self != 0)) {
        QGuiApplication::inputMethod();
        QInputMethod::commit();
      }
      this->focusItem = (QGraphicsItem *)0x0;
      local_48 = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      ppQStack_50 = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_58,FocusOut,focusReason);
      sendEvent(this,this->lastFocusItem,(QEvent *)&local_58);
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_58);
    }
    if ((bVar3) || (pQVar5 = (QGraphicsScene *)QGraphicsItem::scene(item), pQVar5 != this_00)) {
      lVar1 = (this->views).d.size;
      if (lVar1 != 0) {
        ppQVar2 = (this->views).d.ptr;
        lVar6 = 0;
        do {
          QGraphicsViewPrivate::updateInputMethodSensitivity
                    (*(QGraphicsViewPrivate **)(*(long *)((long)ppQVar2 + lVar6) + 8));
          lVar6 = lVar6 + 8;
        } while (lVar1 << 3 != lVar6);
      }
    }
    else {
      this->focusItem = item;
      lVar1 = (this->views).d.size;
      if (lVar1 != 0) {
        ppQVar2 = (this->views).d.ptr;
        lVar6 = 0;
        do {
          QGraphicsViewPrivate::updateInputMethodSensitivity
                    (*(QGraphicsViewPrivate **)(*(long *)((long)ppQVar2 + lVar6) + 8));
          lVar6 = lVar6 + 8;
        } while (lVar1 << 3 != lVar6);
      }
      local_48 = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      ppQStack_50 = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_58,FocusIn,focusReason);
      sendEvent(this,item,(QEvent *)&local_58);
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_58);
    }
    if (!emitFocusChanged) goto LAB_00600fe9;
    local_68 = this_01;
    local_60 = this->focusItem;
  }
  else {
    QGraphicsScene::setFocus(this_00,focusReason);
    this_01 = this->focusItem;
    if (this_01 != item) {
      bVar3 = false;
      goto LAB_00600e3a;
    }
    if (!emitFocusChanged) goto LAB_00600fe9;
    local_68 = (QGraphicsItem *)0x0;
    local_60 = this_01;
  }
  local_40 = &local_6c;
  local_48 = &local_68;
  ppQStack_50 = &local_60;
  local_58 = (undefined1 *)0x0;
  local_6c = focusReason;
  QMetaObject::activate((QObject *)this_00,&QGraphicsScene::staticMetaObject,3,&local_58);
LAB_00600fe9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::setFocusItemHelper(QGraphicsItem *item,
                                               Qt::FocusReason focusReason,
                                               bool emitFocusChanged)
{
    Q_Q(QGraphicsScene);
    if (item == focusItem)
        return;

    // Clear focus if asked to set focus on something that can't
    // accept input focus.
    if (item && (!(item->flags() & QGraphicsItem::ItemIsFocusable)
                 || !item->isVisible() || !item->isEnabled())) {
        item = nullptr;
    }

    // Set focus on the scene if an item requests focus.
    if (item) {
        q->setFocus(focusReason);
        if (item == focusItem) {
            if (emitFocusChanged)
                emit q->focusItemChanged(focusItem, (QGraphicsItem *)nullptr, focusReason);
            return;
        }
    }

    QGraphicsItem *oldFocusItem = focusItem;
    if (focusItem) {
        lastFocusItem = focusItem;

#ifndef QT_NO_IM
        if (lastFocusItem->flags() & QGraphicsItem::ItemAcceptsInputMethod) {
            // Close any external input method panel. This happens
            // automatically by removing WA_InputMethodEnabled on
            // the views, but if we are changing focus, we have to
            // do it ourselves.
            if (qApp)
                QGuiApplication::inputMethod()->commit();
        }
#endif //QT_NO_IM

        focusItem = nullptr;
        QFocusEvent event(QEvent::FocusOut, focusReason);
        sendEvent(lastFocusItem, &event);
    }

    // This handles the case that the item has been removed from the
    // scene in response to the FocusOut event.
    if (item && item->scene() != q)
        item = nullptr;

    if (item)
        focusItem = item;
    updateInputMethodSensitivityInViews();

    if (item) {
        QFocusEvent event(QEvent::FocusIn, focusReason);
        sendEvent(item, &event);
    }

    if (emitFocusChanged)
        emit q->focusItemChanged(focusItem, oldFocusItem, focusReason);
}